

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

IEEEFloat * __thiscall llvm::detail::IEEEFloat::operator=(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  byte bVar2;
  
  freeSignificand(this);
  this->semantics = rhs->semantics;
  this->significand = rhs->significand;
  this->exponent = rhs->exponent;
  bVar2 = rhs->field_0x12 & 7;
  bVar1 = this->field_0x12;
  this->field_0x12 = bVar1 & 0xf8 | bVar2;
  this->field_0x12 = bVar1 & 0xf0 | bVar2 | rhs->field_0x12 & 8;
  rhs->semantics = (fltSemantics *)semBogus;
  return this;
}

Assistant:

IEEEFloat &IEEEFloat::operator=(IEEEFloat &&rhs) {
  freeSignificand();

  semantics = rhs.semantics;
  significand = rhs.significand;
  exponent = rhs.exponent;
  category = rhs.category;
  sign = rhs.sign;

  rhs.semantics = &semBogus;
  return *this;
}